

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

Value * DumpBacktrace(Value *__return_storage_ptr__,cmListFileBacktrace *backtrace)

{
  cmListFileContext *pcVar1;
  Value *pVVar2;
  cmListFileBacktrace backtraceCopy;
  cmListFileBacktrace local_f0;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value entry;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  cmListFileBacktrace::cmListFileBacktrace(&backtraceCopy,backtrace);
  while( true ) {
    pcVar1 = cmListFileBacktrace::Top(&backtraceCopy);
    if ((pcVar1->FilePath)._M_string_length == 0) break;
    Json::Value::Value(&entry,objectValue);
    pcVar1 = cmListFileBacktrace::Top(&backtraceCopy);
    Json::Value::Value(&local_80,&pcVar1->FilePath);
    pVVar2 = Json::Value::operator[](&entry,&kPATH_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_80);
    Json::Value::~Value(&local_80);
    pcVar1 = cmListFileBacktrace::Top(&backtraceCopy);
    if (pcVar1->Line != 0) {
      pcVar1 = cmListFileBacktrace::Top(&backtraceCopy);
      Json::Value::Value(&local_a8,(Int)pcVar1->Line);
      pVVar2 = Json::Value::operator[](&entry,&kLINE_NUMBER_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_a8);
      Json::Value::~Value(&local_a8);
    }
    pcVar1 = cmListFileBacktrace::Top(&backtraceCopy);
    if ((pcVar1->Name)._M_string_length != 0) {
      pcVar1 = cmListFileBacktrace::Top(&backtraceCopy);
      Json::Value::Value(&local_d0,&pcVar1->Name);
      pVVar2 = Json::Value::operator[](&entry,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_d0);
      Json::Value::~Value(&local_d0);
    }
    Json::Value::append(__return_storage_ptr__,&entry);
    cmListFileBacktrace::Pop(&local_f0,&backtraceCopy);
    cmListFileBacktrace::operator=(&backtraceCopy,&local_f0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_f0);
    Json::Value::~Value(&entry);
  }
  cmListFileBacktrace::~cmListFileBacktrace(&backtraceCopy);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpBacktrace(const cmListFileBacktrace& backtrace)
{
  Json::Value result = Json::arrayValue;

  cmListFileBacktrace backtraceCopy = backtrace;
  while (!backtraceCopy.Top().FilePath.empty()) {
    Json::Value entry = Json::objectValue;
    entry[kPATH_KEY] = backtraceCopy.Top().FilePath;
    if (backtraceCopy.Top().Line) {
      entry[kLINE_NUMBER_KEY] = (int)backtraceCopy.Top().Line;
    }
    if (!backtraceCopy.Top().Name.empty()) {
      entry[kNAME_KEY] = backtraceCopy.Top().Name;
    }
    result.append(std::move(entry));
    backtraceCopy = backtraceCopy.Pop();
  }
  return result;
}